

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Accuracy::TextureCubeFilteringCase::~TextureCubeFilteringCase
          (TextureCubeFilteringCase *this)

{
  TextureCubeFilteringCase *this_local;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeFilteringCase_00ca46c8;
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[3])();
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer(&this->m_renderer);
  std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::~vector(&this->m_textures);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_filenames);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TextureCubeFilteringCase::~TextureCubeFilteringCase (void)
{
	deinit();
}